

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O1

void __thiscall xmrig::OclBackend::start(OclBackend *this,IWorker *worker,bool ready)

{
  size_t *psVar1;
  OclBackendPrivate *pOVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pOVar2 = this->d_ptr;
  psVar1 = &(pOVar2->status).m_errors + ready;
  *psVar1 = *psVar1 + 1;
  sVar3 = (pOVar2->status).m_errors;
  sVar4 = (pOVar2->status).m_started;
  sVar5 = (pOVar2->status).m_threads;
  if (sVar3 + sVar4 == sVar5) {
    if (sVar4 == 0) {
      Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m");
    }
    else {
      pcVar8 = "\x1b[1;33m";
      if (sVar3 == 0) {
        pcVar8 = "\x1b[1;36m";
      }
      lVar7 = std::chrono::_V2::steady_clock::now();
      Log::print(INFO,"%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu\x1b[1;30m (%lu ms)\x1b[0m",
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m",pcVar8,sVar4,sVar5,
                 lVar7 / 1000000 - (pOVar2->status).m_ts);
    }
    LOCK();
    OclWorker::ready = 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (ready) {
    (*worker->_vptr_IWorker[8])(worker);
    return;
  }
  return;
}

Assistant:

void xmrig::OclBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(ready)) {
        d_ptr->status.print();

        OclWorker::ready = true;
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}